

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

uint __thiscall EthUdpPort::GetPrefixOffset(EthUdpPort *this,MsgType msg)

{
  ostream *this_00;
  void *this_01;
  MsgType msg_local;
  EthUdpPort *this_local;
  
  switch(msg) {
  case WR_CTRL:
    this_local._4_4_ = 0;
    break;
  case WR_FW_HEADER:
    this_local._4_4_ = 2;
    break;
  case WR_FW_BDATA:
    this_local._4_4_ = 0x16;
    break;
  case RD_FW_HEADER:
    this_local._4_4_ = 0;
    break;
  case RD_FW_BDATA:
    this_local._4_4_ = 0x14;
    break;
  default:
    this_00 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                              "EthUdpPort::GetPrefixOffset: Invalid type: ");
    this_01 = (void *)std::ostream::operator<<(this_00,msg);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int EthUdpPort::GetPrefixOffset(MsgType msg) const
{
    switch (msg) {
        case WR_CTRL:      return 0;
        case WR_FW_HEADER: return FW_CTRL_SIZE;
        case WR_FW_BDATA:  return FW_CTRL_SIZE+FW_BWRITE_HEADER_SIZE;
        case RD_FW_HEADER: return 0;
        case RD_FW_BDATA:  return FW_BRESPONSE_HEADER_SIZE;
    }
    outStr << "EthUdpPort::GetPrefixOffset: Invalid type: " << msg << std::endl;
    return 0;
}